

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracking_ptr.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::track_dependency_(enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *this,enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *dep)

{
  shared_count *this_00;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  undefined8 local_188;
  shared_count sStack_180;
  _Base_ptr local_178;
  set_type *psStack_170;
  undefined8 local_168;
  shared_count sStack_160;
  _Base_ptr local_158;
  set_type *psStack_150;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  undefined8 local_128;
  shared_count sStack_120;
  _Base_ptr local_118;
  set_type *psStack_110;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  undefined8 local_e8;
  shared_count sStack_e0;
  _Base_ptr local_d8;
  set_type *psStack_d0;
  filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c0;
  filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  
  if (this != dep) {
    local_1a8.cur_.px = (dep->self_).px;
    local_1a8.cur_.pn.pi_ = (dep->self_).pn.pi_;
    if (local_1a8.cur_.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1a8.cur_.pn.pi_)->weak_count_ = (local_1a8.cur_.pn.pi_)->weak_count_ + 1;
      UNLOCK();
    }
    this_00 = &local_1a8.cur_.pn;
    std::
    _Rb_tree<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::_Identity<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>,std::less<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>,std::allocator<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
    ::
    _M_insert_unique<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
              ((_Rb_tree<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::_Identity<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>,std::less<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>,std::allocator<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
                *)&this->deps_,
               (weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_1a8);
    boost::detail::weak_count::~weak_count((weak_count *)this_00);
    weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::weak_iterator(&local_148,(dep->deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                    &dep->deps_);
    weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::weak_iterator(&local_1c8,(base_iterator)&(dep->deps_)._M_t._M_impl.super__Rb_tree_header,
                    &dep->deps_);
    if (local_148.cur_.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_148.cur_.pn.pi_)->use_count_ = (local_148.cur_.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_158 = local_148.iter_._M_node;
    psStack_150 = local_148.set_;
    if (local_1c8.cur_.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1c8.cur_.pn.pi_)->use_count_ = (local_1c8.cur_.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_118 = local_1c8.iter_._M_node;
    psStack_110 = local_1c8.set_;
    local_1a8.cur_.px = local_148.cur_.px;
    local_1a8.cur_.pn.pi_ = local_148.cur_.pn.pi_;
    local_168 = 0;
    sStack_160.pi_ = (sp_counted_base *)0x0;
    local_1a8.iter_._M_node = local_148.iter_._M_node;
    local_1a8.set_ = local_148.set_;
    local_108.cur_.px = local_1c8.cur_.px;
    local_108.cur_.pn.pi_ = local_1c8.cur_.pn.pi_;
    local_128 = 0;
    sStack_120.pi_ = (sp_counted_base *)0x0;
    local_108.iter_._M_node = local_1c8.iter_._M_node;
    local_108.set_ = local_1c8.set_;
    iterators::
    filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::filter_iterator(&local_78,
                      (filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )this,&local_1a8,&local_108);
    boost::detail::shared_count::~shared_count(&local_108.cur_.pn);
    boost::detail::shared_count::~shared_count(this_00);
    if (local_1c8.cur_.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1c8.cur_.pn.pi_)->use_count_ = (local_1c8.cur_.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_178 = local_1c8.iter_._M_node;
    psStack_170 = local_1c8.set_;
    if (local_1c8.cur_.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1c8.cur_.pn.pi_)->use_count_ = (local_1c8.cur_.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_d8 = local_1c8.iter_._M_node;
    psStack_d0 = local_1c8.set_;
    local_1a8.cur_.px = local_1c8.cur_.px;
    local_1a8.cur_.pn.pi_ = local_1c8.cur_.pn.pi_;
    local_188 = 0;
    sStack_180.pi_ = (sp_counted_base *)0x0;
    local_1a8.iter_._M_node = local_1c8.iter_._M_node;
    local_1a8.set_ = local_1c8.set_;
    local_108.cur_.px = local_1c8.cur_.px;
    local_108.cur_.pn.pi_ = local_1c8.cur_.pn.pi_;
    local_e8 = 0;
    sStack_e0.pi_ = (sp_counted_base *)0x0;
    local_108.iter_._M_node = local_1c8.iter_._M_node;
    local_108.set_ = local_1c8.set_;
    iterators::
    filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::filter_iterator(&local_c0,
                      (filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )this,&local_1a8,&local_108);
    boost::detail::shared_count::~shared_count(&local_108.cur_.pn);
    boost::detail::shared_count::~shared_count(&local_1a8.cur_.pn);
    std::
    set<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::less<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>,std::allocator<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
    ::
    insert<boost::iterators::filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
              ((set<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::less<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>,std::allocator<boost::weak_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
                *)&this->deps_,&local_78,&local_c0);
    boost::detail::shared_count::~shared_count(&local_c0.m_end.cur_.pn);
    boost::detail::shared_count::~shared_count(&local_c0.super_type.m_iterator.cur_.pn);
    boost::detail::shared_count::~shared_count(&sStack_e0);
    boost::detail::shared_count::~shared_count(&sStack_180);
    boost::detail::shared_count::~shared_count(&local_78.m_end.cur_.pn);
    boost::detail::shared_count::~shared_count(&local_78.super_type.m_iterator.cur_.pn);
    boost::detail::shared_count::~shared_count(&sStack_120);
    boost::detail::shared_count::~shared_count(&sStack_160);
    boost::detail::shared_count::~shared_count(&local_1c8.cur_.pn);
    boost::detail::shared_count::~shared_count(&local_148.cur_.pn);
  }
  return;
}

Assistant:

void track_dependency_(enable_reference_tracking<Derived> &dep)
    {
        if(this == &dep) // never add ourself as a dependency
            return;

        // add dep as a dependency
        this->deps_.insert(dep.self_);

        filter_self<Derived> not_self(this);
        weak_iterator<Derived> begin(dep.deps_.begin(), &dep.deps_);
        weak_iterator<Derived> end(dep.deps_.end(), &dep.deps_);

        // also inherit dep's dependencies
        this->deps_.insert(
            make_filter_iterator(not_self, begin, end)
          , make_filter_iterator(not_self, end, end)
        );
    }